

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteReferences(FBXExporter *this)

{
  shared_ptr<Assimp::IOStream> local_f0;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  Node n;
  allocator local_31;
  string local_30;
  FBXExporter *local_10;
  FBXExporter *this_local;
  
  local_10 = this;
  if ((this->binary & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"Document References",&local_31);
    WriteAsciiSectionHeader(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"References",&local_d9);
  FBX::Node::Node((Node *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  n.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_f0,&this->outfile);
  FBX::Node::Dump((Node *)local_b8,&local_f0,(bool)(this->binary & 1),0);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_f0);
  FBX::Node::~Node((Node *)local_b8);
  return;
}

Assistant:

void FBXExporter::WriteReferences ()
{
    if (!binary) {
        WriteAsciiSectionHeader("Document References");
    }
    // always empty for now.
    // not really sure what this is for.
    FBX::Node n("References");
    n.force_has_children = true;
    n.Dump(outfile, binary, 0);
}